

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.h
# Opt level: O2

FileOptions * __thiscall
google::protobuf::FileDescriptorProto::_internal_mutable_options(FileDescriptorProto *this)

{
  FileOptions *pFVar1;
  Arena *arena;
  
  *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
  if (this->options_ != (FileOptions *)0x0) {
    return this->options_;
  }
  arena = (Arena *)(this->_internal_metadata_).
                   super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   .ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
  }
  pFVar1 = Arena::CreateMaybeMessage<google::protobuf::FileOptions>(arena);
  this->options_ = pFVar1;
  return pFVar1;
}

Assistant:

inline PROTOBUF_NAMESPACE_ID::FileOptions* FileDescriptorProto::_internal_mutable_options() {
  _has_bits_[0] |= 0x00000008u;
  if (options_ == nullptr) {
    auto* p = CreateMaybeMessage<PROTOBUF_NAMESPACE_ID::FileOptions>(GetArenaNoVirtual());
    options_ = p;
  }
  return options_;
}